

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rvm.inc.c
# Opt level: O1

_Bool trans_mulh(DisasContext_conflict12 *ctx,arg_mulh *a)

{
  uint uVar1;
  TCGContext_conflict11 *s;
  TCGTemp *a1;
  TCGTemp *a1_00;
  uintptr_t o;
  TCGv_i64 pTVar2;
  TCGv_i64 a2;
  uintptr_t o_2;
  uintptr_t o_4;
  TCGOpcode TVar3;
  uintptr_t o_3;
  TCGv_i64 rh;
  
  uVar1 = ctx->misa;
  if ((uVar1 >> 0xc & 1) == 0) goto LAB_00c7b25f;
  s = ctx->uc->tcg_ctx;
  a1 = tcg_temp_new_internal_riscv64(s,TCG_TYPE_I64,false);
  rh = (TCGv_i64)((long)a1 - (long)s);
  a1_00 = tcg_temp_new_internal_riscv64(s,TCG_TYPE_I64,false);
  if ((long)a->rs1 == 0) {
    TVar3 = INDEX_op_movi_i64;
    pTVar2 = (TCGv_i64)0x0;
LAB_00c7b1bd:
    tcg_gen_op2_riscv64(s,TVar3,(TCGArg)a1,(TCGArg)pTVar2);
  }
  else if (s->cpu_gpr[a->rs1] != rh) {
    pTVar2 = s->cpu_gpr[a->rs1] + (long)s;
    TVar3 = INDEX_op_mov_i64;
    goto LAB_00c7b1bd;
  }
  pTVar2 = (TCGv_i64)((long)a1_00 - (long)s);
  if ((long)a->rs2 == 0) {
    TVar3 = INDEX_op_movi_i64;
    a2 = (TCGv_i64)0x0;
LAB_00c7b200:
    tcg_gen_op2_riscv64(s,TVar3,(TCGArg)a1_00,(TCGArg)a2);
  }
  else if (s->cpu_gpr[a->rs2] != pTVar2) {
    a2 = s->cpu_gpr[a->rs2] + (long)s;
    TVar3 = INDEX_op_mov_i64;
    goto LAB_00c7b200;
  }
  tcg_gen_muls2_i64_riscv64(s,pTVar2,rh,rh,pTVar2);
  if (((long)a->rd != 0) && (s->cpu_gpr[a->rd] != rh)) {
    tcg_gen_op2_riscv64(s,INDEX_op_mov_i64,(TCGArg)(s->cpu_gpr[a->rd] + (long)s),(TCGArg)a1);
  }
  tcg_temp_free_internal_riscv64(s,(TCGTemp *)(rh + (long)s));
  tcg_temp_free_internal_riscv64(s,(TCGTemp *)(pTVar2 + (long)s));
LAB_00c7b25f:
  return (_Bool)((byte)(uVar1 >> 0xc) & 1);
}

Assistant:

static bool trans_mulh(DisasContext *ctx, arg_mulh *a)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    REQUIRE_EXT(ctx, RVM);
    TCGv source1 = tcg_temp_new(tcg_ctx);
    TCGv source2 = tcg_temp_new(tcg_ctx);
    gen_get_gpr(tcg_ctx, source1, a->rs1);
    gen_get_gpr(tcg_ctx, source2, a->rs2);

    tcg_gen_muls2_tl(tcg_ctx, source2, source1, source1, source2);

    gen_set_gpr(tcg_ctx, a->rd, source1);
    tcg_temp_free(tcg_ctx, source1);
    tcg_temp_free(tcg_ctx, source2);
    return true;
}